

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_decoder_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::PriceSyncDecoderTest::ExpectPriceContains
          (PriceSyncDecoderTest *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *fields,PriceEvent *event)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  char *pcVar5;
  AssertionResult gtest_ar;
  iterator element;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  price_map;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_88;
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  local_60;
  
  (*event->_vptr_PriceEvent[2])(&local_60,event);
  p_Var3 = (fields->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(fields->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    do {
      local_68._M_node =
           (_Base_ptr)
           std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::find(&local_60,(key_type *)(p_Var3 + 1));
      local_88._M_node = &p_Var1->_M_header;
      testing::internal::
      CmpHelperNE<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
                (local_80,"price_map.end()","element",&local_88,&local_68);
      if (local_80[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_88);
        pcVar5 = "";
        if (local_78.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((local_78.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_sync_decoder_test.cpp"
                   ,0x39,pcVar5);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_88._M_node != (_Base_ptr)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_88._M_node != (_Base_ptr)0x0)) {
            (**(code **)(*(long *)local_88._M_node + 8))();
          }
          local_88._M_node = (_Base_ptr)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if ((_Rb_tree_header *)local_68._M_node != p_Var1) {
        testing::internal::
        CmpHelperEQ<bidfx_public_api::price::PriceField,bidfx_public_api::price::PriceField>
                  (local_80,"entry.second","element->second",(PriceField *)(p_Var3 + 2),
                   (PriceField *)(local_68._M_node + 2));
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_88);
          pcVar5 = "";
          if (local_78.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((local_78.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_sync_decoder_test.cpp"
                     ,0x3c,pcVar5);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if (local_88._M_node != (_Base_ptr)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_88._M_node != (_Base_ptr)0x0)) {
              (**(code **)(*(long *)local_88._M_node + 8))();
            }
            local_88._M_node = (_Base_ptr)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void PriceSyncDecoderTest::ExpectPriceContains(std::map<std::string, PriceField>& fields, PriceEvent& event)
{
    std::map<std::string, PriceField> price_map = event.GetPrice();
    for (auto const& entry : fields)
    {
        std::map<std::string, PriceField>::iterator element = price_map.find(entry.first);
        EXPECT_NE(price_map.end(), element);
        if (element != price_map.end())
        {
            EXPECT_EQ(entry.second, element->second);
        }
    }
}